

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_http_req_handler.c
# Opt level: O3

_Bool uo_http_req_handler_try
                (uo_http_req_handler *http_req_handler,char *method_sp_uri,uo_strhashtbl *params,
                uo_refstack *refstack)

{
  size_t sVar1;
  size_t sVar2;
  uo_strhashtbl *hashtbl;
  size_t sVar3;
  uo_refcount *puVar4;
  void **__ptr;
  char cVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  long *plVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  undefined8 auStack_78 [2];
  uo_refstack uStack_68;
  uo_strhashtbl *local_50;
  uo_refcount *local_48;
  char *local_40;
  uo_http_req_handler *local_38;
  
  uStack_68.count = (size_t)&uStack_68;
  pcVar10 = http_req_handler->req_pattern;
  sVar12 = http_req_handler->param_count;
  if (sVar12 == 0) {
    lVar7 = 0;
    do {
      cVar5 = pcVar10[lVar7];
      if (cVar5 != method_sp_uri[lVar7]) {
        return cVar5 == '*';
      }
      lVar7 = lVar7 + 1;
    } while (cVar5 != '\0');
  }
  else {
    lVar7 = -(sVar12 * 0x18 + 0xf & 0xfffffffffffffff0);
    uStack_68.capacity = (size_t)refstack;
    local_50 = params;
    local_38 = http_req_handler;
    do {
      cVar5 = *pcVar10;
      pcVar11 = pcVar10;
      pcVar8 = method_sp_uri;
      if (cVar5 == *method_sp_uri) {
        do {
          pcVar8 = pcVar8 + 1;
          cVar5 = pcVar11[1];
          pcVar11 = pcVar11 + 1;
        } while (cVar5 == *pcVar8);
      }
      if (cVar5 != '{') {
        return false;
      }
      sVar12 = sVar12 - 1;
      lVar6 = sVar12 * 0x18;
      *(char **)((long)&uStack_68 + lVar7 + lVar6) = pcVar11 + 1;
      local_40 = method_sp_uri + ((long)pcVar11 - (long)pcVar10);
      *(char **)((long)&uStack_68 + lVar6 + lVar7 + 8) = local_40;
      *(undefined8 *)((long)auStack_78 + lVar7 + 8) = 0x101993;
      sVar3 = strlen(pcVar11);
      pcVar10 = local_40;
      cVar5 = pcVar11[sVar3 + 1];
      *(undefined8 *)((long)auStack_78 + lVar7 + 8) = 0x1019a5;
      method_sp_uri = strchr(pcVar10,(int)cVar5);
      if (method_sp_uri == (char *)0x0) {
        return false;
      }
      pcVar10 = pcVar11 + sVar3 + 1;
      *(char **)((long)&uStack_68 + lVar6 + lVar7 + 0x10) = method_sp_uri;
    } while (sVar12 != 0);
    lVar6 = 0;
    do {
      cVar5 = pcVar11[lVar6 + sVar3 + 1];
      if (cVar5 != method_sp_uri[lVar6]) {
        if (cVar5 != '*') {
          return false;
        }
        break;
      }
      lVar6 = lVar6 + 1;
    } while (cVar5 != '\0');
    sVar12 = local_38->param_count;
    local_40 = (char *)((long)&uStack_68 + lVar7);
    local_38 = (uo_http_req_handler *)(sVar12 * 3);
    pcVar10 = *(char **)((long)auStack_78 + sVar12 * 0x18 + lVar7);
    *(undefined8 *)((long)auStack_78 + lVar7 + 8) = 0x101a32;
    pcVar8 = strdup(pcVar10);
    *(undefined8 *)((long)auStack_78 + lVar7 + 8) = 0x101a44;
    puVar4 = uo_refcount_create(pcVar8,free);
    sVar2 = uStack_68.capacity;
    __ptr = *(void ***)uStack_68.capacity;
    sVar1 = *(size_t *)(uStack_68.capacity + 8);
    *(size_t *)(uStack_68.capacity + 8) = sVar1 + 1;
    if (sVar1 == *(size_t *)(uStack_68.capacity + 0x10)) {
      *(size_t *)(uStack_68.capacity + 0x10) = sVar1 * 2;
      local_48 = puVar4;
      *(undefined8 *)((long)auStack_78 + lVar7 + 8) = 0x101a7b;
      __ptr = (void **)realloc(__ptr,sVar1 << 4);
      *(void ***)sVar2 = __ptr;
      puVar4 = local_48;
    }
    hashtbl = local_50;
    __ptr[sVar1] = puVar4;
    if (sVar12 != 0) {
      plVar9 = (long *)((long)local_40 + (long)local_38 * 8 + -8);
      do {
        lVar6 = plVar9[-1];
        pcVar8[*plVar9 - (long)pcVar10] = '\0';
        pcVar11 = (char *)plVar9[-2];
        *(undefined8 *)((long)auStack_78 + lVar7 + 8) = 0x101ac2;
        uo_strhashtbl_set(hashtbl,pcVar11,pcVar8 + (lVar6 - (long)pcVar10));
        plVar9 = plVar9 + -3;
        sVar12 = sVar12 - 1;
      } while (sVar12 != 0);
    }
  }
  return true;
}

Assistant:

bool uo_http_req_handler_try(
    uo_http_req_handler *http_req_handler,
    const char *method_sp_uri,
    uo_strhashtbl *params,
    uo_refstack *refstack)
{
    char *req_pattern = http_req_handler->req_pattern;
    size_t i = http_req_handler->param_count;

    if (i == 0)
    {
        // request line is checked for exact match or prefix match
        char *p = uo_strdiff(req_pattern, method_sp_uri);
        return !p || *p == '*';
    }

    // temporary array for pattern parameter name start, value start and value end pointers
    char *param_ptrs[i * 3];

    while (i--)
    {
        // find pattern parameter
        char *param_start = uo_strdiff(req_pattern, method_sp_uri);

        if (*param_start != '{')
            return false;

        // store pattern parameter name pointer
        param_ptrs[i * 3] = param_start + 1;

        // store matched pattern parameter value start pointer
        param_ptrs[i * 3 + 1] = (char *)(method_sp_uri += param_start - req_pattern);

        // skip pattern parameter name
        req_pattern = param_start + strlen(param_start) + 1;

        // find pattern parameter value end
        method_sp_uri = strchr(method_sp_uri, *req_pattern);

        if (!method_sp_uri)
            return false;

        // store matched pattern parameter end pointer
        param_ptrs[i * 3 + 2] = (char *)method_sp_uri;
    }

    {
        // chech if the request line end either a exact match or a prefix match
        char *p = uo_strdiff(req_pattern, method_sp_uri);
        if (p && *p != '*')
            return false;
    }

    // req_handler matches the request method and URI
    // now store the pattern parameters

    i = http_req_handler->param_count;
    char *first_param_value = param_ptrs[(i - 1) * 3 + 1];
    char *param_value_buf = strdup(first_param_value);
    uo_refstack_push(refstack, param_value_buf, free);

    while (i--)
    {
        // null terminate parameter value
        char *param_value = param_value_buf + (param_ptrs[i * 3 + 1] - first_param_value);
        param_value_buf[param_ptrs[i * 3 + 2] - first_param_value] = '\0';

        // get parameter name
        char *param_name = param_ptrs[i * 3];

        // store parameter name and value
        uo_strhashtbl_set(params, param_name, param_value);
    }

    return true;
}